

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteStateMachine.hpp
# Opt level: O1

shared_ptr<peach::fsm::Node> __thiscall
peach::fsm::Node::
addTransitionToNewNode<peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::RangeCharTransitionTemplate<(char)97,(char)122>,peach::transition::RangeCharTransitionTemplate<(char)65,(char)90>>,peach::transition::SingleCharTransitionTemplate<(char)95>>>
          (Node *this,tokenCategory_t category)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<peach::fsm::Node> sVar2;
  shared_ptr<peach::fsm::Node> local_30;
  
  (this->transitions_).
  super__Vector_base<std::pair<std::unique_ptr<peach::transition::CharTransition,_std::default_delete<peach::transition::CharTransition>_>,_std::shared_ptr<peach::fsm::Node>_>,_std::allocator<std::pair<std::unique_ptr<peach::transition::CharTransition,_std::default_delete<peach::transition::CharTransition>_>,_std::shared_ptr<peach::fsm::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_30.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  (((pointer)
   local_30.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  second).super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  (((pointer)
   local_30.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  first)._M_t.
  super___uniq_ptr_impl<peach::transition::CharTransition,_std::default_delete<peach::transition::CharTransition>_>
  ._M_t.
  super__Tuple_impl<0UL,_peach::transition::CharTransition_*,_std::default_delete<peach::transition::CharTransition>_>
  .super__Head_base<0UL,_peach::transition::CharTransition_*,_false>._M_head_impl =
       (CharTransition *)&PTR___Sp_counted_ptr_inplace_001321f0;
  local_30.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       &(((pointer)
         local_30.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         )->second).super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  (((pointer)
   local_30.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  second).super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (((pointer)
   ((long)local_30.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi + 0x18))->first)._M_t.
  super___uniq_ptr_impl<peach::transition::CharTransition,_std::default_delete<peach::transition::CharTransition>_>
  ._M_t.
  super__Tuple_impl<0UL,_peach::transition::CharTransition_*,_std::default_delete<peach::transition::CharTransition>_>
  .super__Head_base<0UL,_peach::transition::CharTransition_*,_false>._M_head_impl =
       (CharTransition *)0x0;
  (((pointer)
   ((long)local_30.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi + 0x18))->second).super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (((pointer)
   ((long)local_30.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi + 0x18))->second).super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = in_RDX;
  (this->transitions_).
  super__Vector_base<std::pair<std::unique_ptr<peach::transition::CharTransition,_std::default_delete<peach::transition::CharTransition>_>,_std::shared_ptr<peach::fsm::Node>_>,_std::allocator<std::pair<std::unique_ptr<peach::transition::CharTransition,_std::default_delete<peach::transition::CharTransition>_>,_std::shared_ptr<peach::fsm::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_30.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  (this->transitions_).
  super__Vector_base<std::pair<std::unique_ptr<peach::transition::CharTransition,_std::default_delete<peach::transition::CharTransition>_>,_std::shared_ptr<peach::fsm::Node>_>,_std::allocator<std::pair<std::unique_ptr<peach::transition::CharTransition,_std::default_delete<peach::transition::CharTransition>_>,_std::shared_ptr<peach::fsm::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_30.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(int *)&(((pointer)
              local_30.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->second).super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr =
         *(int *)&(((pointer)
                   local_30.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->second).
                  super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    UNLOCK();
  }
  else {
    *(undefined4 *)
     &(((pointer)
       local_30.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->second).super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 2;
  }
  addTransition<peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::RangeCharTransitionTemplate<(char)97,(char)122>,peach::transition::RangeCharTransitionTemplate<(char)65,(char)90>>,peach::transition::SingleCharTransitionTemplate<(char)95>>>
            ((Node *)category,&local_30);
  _Var1._M_pi = extraout_RDX;
  if ((pointer)local_30.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<peach::fsm::Node>)
         sVar2.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Node> addTransitionToNewNode(token::tokenCategory_t category, TransitionArgs &&... args)
    {
        auto newNode = std::make_shared<Node>(category);
        addTransition<Transition>(newNode, std::forward<TransitionArgs>(args)...);
        return newNode;
    }